

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool CheckShader(GLuint handle,char *desc)

{
  undefined8 uVar1;
  FILE *__stream;
  uint uVar2;
  char *pcVar3;
  undefined1 local_30 [8];
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  char *desc_local;
  GLuint handle_local;
  
  buf.Data._4_4_ = 0;
  buf.Data._0_4_ = 0;
  (*gl3wProcs.ptr[0x105])((ulong)handle,0x8b81,(undefined1 *)((long)&buf.Data + 4));
  (*gl3wProcs.ptr[0x105])((ulong)handle,0x8b84,&buf.Data);
  if ((buf.Data._4_4_ & 0xff) == 0) {
    fprintf(_stderr,"ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n",desc);
  }
  if (1 < (int)(uint)buf.Data) {
    ImVector<char>::ImVector((ImVector<char> *)local_30);
    ImVector<char>::resize((ImVector<char> *)local_30,(uint)buf.Data + 1);
    uVar2 = (uint)buf.Data;
    uVar1 = gl3wProcs.ptr[0x102];
    pcVar3 = ImVector<char>::begin((ImVector<char> *)local_30);
    (*(code *)uVar1)((ulong)handle,(ulong)uVar2,0,pcVar3);
    __stream = _stderr;
    pcVar3 = ImVector<char>::begin((ImVector<char> *)local_30);
    fprintf(__stream,"%s\n",pcVar3);
    ImVector<char>::~ImVector((ImVector<char> *)local_30);
  }
  return (buf.Data._4_4_ & 0xff) == 1;
}

Assistant:

static bool CheckShader(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetShaderiv(handle, GL_COMPILE_STATUS, &status);
    glGetShaderiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to compile %s!\n", desc);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetShaderInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}